

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O0

void __thiscall
kpeg::MCU::constructMCU
          (MCU *this,array<std::vector<int,_std::allocator<int>_>,_3UL> *compRLE,
          vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          *QTables)

{
  ushort uVar1;
  value_type vVar2;
  value_type_conflict vVar3;
  Level LVar4;
  Logger *pLVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  reference this_00;
  reference pvVar10;
  reference pvVar11;
  ostream *poVar12;
  char *pcVar13;
  void *pvVar14;
  pair<const_int,_const_int> coords;
  int i_2;
  int i_1;
  int QIndex;
  int i;
  int j;
  array<int,_64UL> zzOrder;
  int compID;
  char *type [2];
  char *component [3];
  int *in_stack_fffffffffffffd48;
  array<std::array<std::array<int,_8UL>,_8UL>,_3UL> *in_stack_fffffffffffffd50;
  char *local_278;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *in_stack_fffffffffffffde8;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *in_stack_fffffffffffffdf0;
  char *local_1f0;
  string local_1c0 [36];
  pair<const_int,_const_int> local_19c;
  Level in_stack_fffffffffffffe6c;
  int local_190;
  int local_188;
  MCU *in_stack_fffffffffffffe90;
  MCU *in_stack_fffffffffffffeb0;
  int local_7c;
  string local_38 [56];
  
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  m_MCUCount = m_MCUCount + 1;
  pLVar5 = Logger::get();
  LVar4 = Logger::getLevel(pLVar5);
  if (1 < (int)LVar4) {
    pLVar5 = Logger::get();
    poVar12 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(in_stack_fffffffffffffe6c);
    poVar12 = std::operator<<(poVar12,local_38);
    poVar12 = std::operator<<(poVar12,"[ kpeg:");
    pcVar13 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                      ,0x2f);
    if (pcVar13 == (char *)0x0) {
      local_1f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
      ;
    }
    else {
      local_1f0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                          ,0x2f);
      local_1f0 = local_1f0 + 1;
    }
    poVar12 = std::operator<<(poVar12,local_1f0);
    poVar12 = std::operator<<(poVar12,":");
    pvVar14 = (void *)std::ostream::operator<<(poVar12,std::dec);
    poVar12 = (ostream *)std::ostream::operator<<(pvVar14,0x46);
    poVar12 = std::operator<<(poVar12," ] ");
    poVar12 = std::operator<<(poVar12,"Constructing MCU: ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,m_MCUCount);
    poVar12 = std::operator<<(poVar12,"...");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
  }
  local_7c = 0;
  do {
    if (2 < local_7c) {
      computeIDCT(in_stack_fffffffffffffeb0);
      performLevelShift(in_stack_fffffffffffffe90);
      convertYCbCrToRGB(in_stack_fffffffffffffeb0);
      pLVar5 = Logger::get();
      LVar4 = Logger::getLevel(pLVar5);
      if (1 < (int)LVar4) {
        pLVar5 = Logger::get();
        poVar12 = Logger::getStream(pLVar5);
        Logger::levelStr_abi_cxx11_(in_stack_fffffffffffffe6c);
        poVar12 = std::operator<<(poVar12,local_1c0);
        poVar12 = std::operator<<(poVar12,"[ kpeg:");
        pcVar13 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                          ,0x2f);
        if (pcVar13 == (char *)0x0) {
          local_278 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
          ;
        }
        else {
          local_278 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                              ,0x2f);
          local_278 = local_278 + 1;
        }
        poVar12 = std::operator<<(poVar12,local_278);
        poVar12 = std::operator<<(poVar12,":");
        pvVar14 = (void *)std::ostream::operator<<(poVar12,std::dec);
        poVar12 = (ostream *)std::ostream::operator<<(pvVar14,0x95);
        poVar12 = std::operator<<(poVar12," ] ");
        poVar12 = std::operator<<(poVar12,"Finished constructing MCU: ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,m_MCUCount);
        poVar12 = std::operator<<(poVar12,"...");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1c0);
      }
      return;
    }
    std::array<int,_64UL>::begin((array<int,_64UL> *)0x17227c);
    std::array<int,_64UL>::end((array<int,_64UL> *)0x172291);
    std::fill<int*,int>((int *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,(int *)0x1722b4);
    local_188 = 0;
    while( true ) {
      pvVar6 = std::array<std::vector<int,_std::allocator<int>_>,_3UL>::operator[]
                         ((array<std::vector<int,_std::allocator<int>_>,_3UL> *)
                          in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      sVar7 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar7 - 2 < (ulong)(long)local_188) break;
      pvVar6 = std::array<std::vector<int,_std::allocator<int>_>,_3UL>::operator[]
                         ((array<std::vector<int,_std::allocator<int>_>,_3UL> *)
                          in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_188);
      if (*pvVar8 == 0) {
        pvVar6 = std::array<std::vector<int,_std::allocator<int>_>,_3UL>::operator[]
                           ((array<std::vector<int,_std::allocator<int>_>,_3UL> *)
                            in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(local_188 + 1));
        if (*pvVar8 == 0) break;
      }
      pvVar6 = std::array<std::vector<int,_std::allocator<int>_>,_3UL>::operator[]
                         ((array<std::vector<int,_std::allocator<int>_>,_3UL> *)
                          in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_188);
      pvVar6 = std::array<std::vector<int,_std::allocator<int>_>,_3UL>::operator[]
                         ((array<std::vector<int,_std::allocator<int>_>,_3UL> *)
                          in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(local_188 + 1));
      vVar2 = *pvVar8;
      pvVar9 = std::array<int,_64UL>::operator[]
                         ((array<int,_64UL> *)in_stack_fffffffffffffd50,
                          (size_type)in_stack_fffffffffffffd48);
      *pvVar9 = vVar2;
      local_188 = local_188 + 2;
    }
    pvVar9 = std::array<int,_64UL>::operator[]
                       ((array<int,_64UL> *)in_stack_fffffffffffffd50,
                        (size_type)in_stack_fffffffffffffd48);
    *(value_type_conflict *)(DCDiff + (long)local_7c * 4) =
         *pvVar9 + *(int *)(DCDiff + (long)local_7c * 4);
    vVar3 = *(value_type_conflict *)(DCDiff + (long)local_7c * 4);
    pvVar9 = std::array<int,_64UL>::operator[]
                       ((array<int,_64UL> *)in_stack_fffffffffffffd50,
                        (size_type)in_stack_fffffffffffffd48);
    *pvVar9 = vVar3;
    for (local_190 = 0; local_190 < 0x40; local_190 = local_190 + 1) {
      this_00 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[]((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              *)m_QTables,(long)(int)(uint)(local_7c != 0));
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (this_00,(long)local_190);
      uVar1 = *pvVar10;
      pvVar9 = std::array<int,_64UL>::operator[]
                         ((array<int,_64UL> *)in_stack_fffffffffffffd50,
                          (size_type)in_stack_fffffffffffffd48);
      *pvVar9 = (uint)uVar1 * *pvVar9;
    }
    for (in_stack_fffffffffffffe6c = ERROR; (int)in_stack_fffffffffffffe6c < 0x40;
        in_stack_fffffffffffffe6c = in_stack_fffffffffffffe6c + INFO) {
      local_19c = zzOrderToMatIndices(in_stack_fffffffffffffe6c);
      pvVar9 = std::array<int,_64UL>::operator[]
                         ((array<int,_64UL> *)in_stack_fffffffffffffd50,
                          (size_type)in_stack_fffffffffffffd48);
      vVar3 = *pvVar9;
      std::array<std::array<std::array<int,_8UL>,_8UL>,_3UL>::operator[]
                (in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      std::array<std::array<int,_8UL>,_8UL>::operator[]
                (in_stack_fffffffffffffd50->_M_elems,(size_type)in_stack_fffffffffffffd48);
      pvVar11 = std::array<int,_8UL>::operator[]
                          ((array<int,_8UL> *)in_stack_fffffffffffffd50,
                           (size_type)in_stack_fffffffffffffd48);
      *pvVar11 = vVar3;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

void MCU::constructMCU( const std::array<std::vector<int>, 3>& compRLE, const std::vector<std::vector<UInt16>>& QTables )
    {
        m_QTables = QTables;
        
        m_MCUCount++;
        
        LOG(Logger::Level::DEBUG) << "Constructing MCU: " << m_MCUCount << "..." << std::endl;
        
//         for ( auto&& rle : compRLE )
//         {
//             std::string rleStr = "";
//             for ( auto v = 0; v < rle.size(); v += 2 )
//             {
//                 std::stringstream ss;
//                 ss << "(" << rle[v] << ", " << rle[v + 1] << ") ";
//                 rleStr += ss.str();
//             }
//             
//             LOG(Logger::Level::DEBUG) << "RLE decoded data: " << rleStr << std::endl;
//         }
        
        const char* component[] = { "Y (Luminance)", "Cb (Chrominance)", "Cr (Chrominance)" };
        const char* type[] = { "DC", "AC" };    
        
        for ( int compID = 0; compID < 3; compID++ )
        {
            //LOG(Logger::Level::DEBUG) << "Constructing matrix for: MCU-" << m_MCUCount << ": " << component[compID] << "..." << std::endl;
            
            // Initialize with all zeros
            std::array<int, 64> zzOrder;            
            std::fill( zzOrder.begin(), zzOrder.end(), 0 );
            int j = -1;
            
            for ( auto i = 0; i <= compRLE[compID].size() - 2; i += 2 )
            {
                if ( compRLE[compID][i] == 0 && compRLE[compID][i + 1] == 0 )
                    break;
                
                j += compRLE[compID][i] + 1; // Skip the number of positions containing zeros
                zzOrder[j] = compRLE[compID][i + 1];
            }
            
            // DC_i = DC_i-1 + DC-difference
            DCDiff[compID] += zzOrder[0];
            zzOrder[0] = DCDiff[compID];
            
            int QIndex = compID == 0 ? 0 : 1;
            for ( auto i = 0; i < 64; ++i ) // !!!!!! i = 1
                zzOrder[i] *= m_QTables[QIndex][i];
            
            // Zig-zag order to 2D matrix order
            for ( auto i = 0; i < 64; ++i )
            {
                auto coords = zzOrderToMatIndices( i );
                
                m_8x8block[compID][ coords.first ][ coords.second ] = zzOrder[i];
            }
            
//             for ( auto&& row : m_8x8block[compID] )
//             {
//                 for ( auto&& val : row )
//                     std::cout << val << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;

//             std::string matrix = "";
//             for ( auto&& row : m_8x8block[compID] )
//             {
//                 for ( auto&& val : row )
//                 {
//                     std::stringstream ss;
//                     ss << std::setw(7) << std::setfill(' ') << val << "";
//                     matrix += ss.str();
//                 }
//                 matrix += "\n";
//             }
//             
//             LOG(Logger::Level::DEBUG) << "DCT Matrix: " << component[compID] << ":-\n" << matrix << std::endl;
        }
        
        computeIDCT();
        performLevelShift();
        convertYCbCrToRGB();
        
        LOG(Logger::Level::DEBUG) << "Finished constructing MCU: " << m_MCUCount << "..." << std::endl;
    }